

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O3

void __thiscall
cmExportCommand::StorePackageRegistryDir
          (cmExportCommand *this,string *package,char *content,char *hash)

{
  cmMakefile *this_00;
  bool bVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  string fname;
  ostringstream e;
  cmGeneratedFileStream entry;
  undefined1 auStack_438 [8];
  string local_430;
  string local_410;
  undefined1 local_3f0 [376];
  undefined1 local_278 [584];
  
  __s = cmsys::SystemTools::GetEnv("HOME");
  if (__s != (char *)0x0) {
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,__s,__s + sVar2);
    cmsys::SystemTools::ConvertToUnixSlashes(&local_430);
    std::__cxx11::string::append((char *)&local_430);
    std::__cxx11::string::_M_append((char *)&local_430,(ulong)(package->_M_dataplus)._M_p);
    cmsys::SystemTools::MakeDirectory(local_430._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_430);
    std::__cxx11::string::append((char *)&local_430);
    bVar1 = cmsys::SystemTools::FileExists(local_430._M_dataplus._M_p);
    if (!bVar1) {
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_278,local_430._M_dataplus._M_p,true);
      if ((*(uint *)(*(_func_int **)(local_278._0_8_ + -0x18) + (long)(local_278 + 0x20)) & 5) == 0)
      {
        if (content == (char *)0x0) {
          std::ios::clear((int)(auStack_438 + (long)*(_func_int **)(local_278._0_8_ + -0x18)) +
                          0x1c0);
        }
        else {
          sVar2 = strlen(content);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,content,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3f0,"Cannot create package registry file:\n",0x25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"  ",2);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3f0,local_430._M_dataplus._M_p,
                            local_430._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_410._M_dataplus._M_p,local_410._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        this_00 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,WARNING,&local_410);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
        std::ios_base::~ios_base((ios_base *)(local_3f0 + 0x70));
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmExportCommand::StorePackageRegistryDir(std::string const& package,
                                              const char* content,
                                              const char* hash)
{
#if defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (find_directory(B_USER_SETTINGS_DIRECTORY, -1, false, dir, sizeof(dir)) !=
      B_OK)
    {
    return;
    }
  std::string fname = dir;
  fname += "/cmake/packages/";
  fname += package;
#else
  const char* home = cmSystemTools::GetEnv("HOME");
  if(!home)
    {
    return;
    }
  std::string fname = home;
  cmSystemTools::ConvertToUnixSlashes(fname);
  fname += "/.cmake/packages/";
  fname += package;
#endif
  cmSystemTools::MakeDirectory(fname.c_str());
  fname += "/";
  fname += hash;
  if(!cmSystemTools::FileExists(fname.c_str()))
    {
    cmGeneratedFileStream entry(fname.c_str(), true);
    if(entry)
      {
      entry << content << "\n";
      }
    else
      {
      std::ostringstream e;
      e << "Cannot create package registry file:\n"
        << "  " << fname << "\n"
        << cmSystemTools::GetLastSystemError() << "\n";
      this->Makefile->IssueMessage(cmake::WARNING, e.str());
      }
    }
}